

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvariablebyte.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::StreamVByte::decodeArray
          (StreamVByte *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint8_t *puVar2;
  ulong count;
  
  uVar1 = *in;
  count = (ulong)uVar1;
  *nvalue = count;
  if (count != 0) {
    puVar2 = svb_decode_avx_simple
                       (out,(uint8_t *)(in + 1),(uint8_t *)((long)in + (ulong)(uVar1 + 3 >> 2) + 4),
                        count);
    return (uint32_t *)((ulong)(puVar2 + 3) & 0xfffffffffffffffc);
  }
  return (uint32_t *)0x0;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t /* count */,
                              uint32_t *out, size_t &nvalue) {
    uint32_t count = *(uint32_t *)in; // first 4 bytes is number of ints
    nvalue = count;
    if (count == 0)
      return 0;

    uint8_t *keyPtr = (uint8_t *)in + 4; // full list of keys is next
    uint32_t keyLen = ((count + 3) / 4); // 2-bits per key (rounded up)
    uint8_t *dataPtr = keyPtr + keyLen;  // data starts at end of keys
    nvalue = count;
    return reinterpret_cast<const uint32_t *>(
        (reinterpret_cast<uintptr_t>(
             svb_decode_avx_simple(out, keyPtr, dataPtr, count)) +
         3) &
        ~3);
  }